

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O2

void __thiscall t_java_generator::generate_java_union(t_java_generator *this,t_struct *tstruct)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ostream *poVar3;
  iterator iVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  int __oflag;
  t_struct *tstruct_00;
  t_struct *tstruct_01;
  t_struct *tstruct_02;
  t_java_generator *ptVar5;
  char *pcVar6;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_> *out;
  string f_struct_name;
  ofstream_with_content_based_conditional_update f_struct;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_248;
  undefined1 local_228 [32];
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_> local_1c8;
  
  ptVar5 = (t_java_generator *)&this->package_dir_;
  std::operator+(&bStack_248,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ptVar5,"/");
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  make_valid_java_identifier((string *)local_228,ptVar5,(string *)CONCAT44(extraout_var,iVar2));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c8,
                 &bStack_248,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_228 + 0x40),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1c8,
                 ".java");
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)local_228);
  std::__cxx11::string::~string((string *)&bStack_248);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update(&local_1c8);
  std::__cxx11::string::string
            ((string *)&bStack_248,local_1e8._M_dataplus._M_p,(allocator *)local_228);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (&local_1c8,(char *)&bStack_248,__oflag);
  std::__cxx11::string::~string((string *)&bStack_248);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&bStack_248,this);
  poVar3 = std::operator<<((ostream *)&local_1c8,(string *)&bStack_248);
  java_package_abi_cxx11_((string *)local_228,this);
  ptVar5 = (t_java_generator *)local_228;
  poVar3 = std::operator<<(poVar3,(string *)ptVar5);
  java_suppressions_abi_cxx11_((string *)(local_228 + 0x20),ptVar5);
  std::operator<<(poVar3,(string *)(local_228 + 0x20));
  std::__cxx11::string::~string((string *)(local_228 + 0x20));
  std::__cxx11::string::~string((string *)local_228);
  std::__cxx11::string::~string((string *)&bStack_248);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x22])
            (this,&local_1c8,tstruct);
  std::__cxx11::string::string((string *)&bStack_248,"final",(allocator *)local_228);
  this_00 = &(tstruct->super_t_type).annotations_;
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&bStack_248);
  std::__cxx11::string::~string((string *)&bStack_248);
  bVar1 = is_deprecated(this,this_00);
  if (this->suppress_generated_annotations_ == false) {
    generate_javax_generated_annotation(this,(ostream *)&local_1c8);
  }
  if (bVar1) {
    poVar3 = t_generator::indent((t_generator *)this,(ostream *)&local_1c8);
    poVar3 = std::operator<<(poVar3,"@Deprecated");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  poVar3 = t_generator::indent((t_generator *)this,(ostream *)&local_1c8);
  poVar3 = std::operator<<(poVar3,"public ");
  pcVar6 = "final ";
  if ((_Rb_tree_header *)iVar4._M_node ==
      &(tstruct->super_t_type).annotations_._M_t._M_impl.super__Rb_tree_header) {
    pcVar6 = "";
  }
  poVar3 = std::operator<<(poVar3,pcVar6);
  poVar3 = std::operator<<(poVar3,"class ");
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_00,iVar2));
  poVar3 = std::operator<<(poVar3," extends org.apache.thrift.TUnion<");
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_01,iVar2));
  poVar3 = std::operator<<(poVar3,", ");
  iVar2 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_02,iVar2));
  std::operator<<(poVar3,"._Fields> ");
  t_oop_generator::scope_up(&this->super_t_oop_generator,(ostream *)&local_1c8);
  generate_struct_desc(this,(ostream *)&local_1c8,tstruct);
  generate_field_descs(this,(ostream *)&local_1c8,tstruct);
  std::operator<<((ostream *)&local_1c8,(string *)&::endl_abi_cxx11_);
  generate_field_name_constants(this,(ostream *)&local_1c8,tstruct);
  std::operator<<((ostream *)&local_1c8,(string *)&::endl_abi_cxx11_);
  generate_java_meta_data_map(this,(ostream *)&local_1c8,tstruct);
  generate_union_constructor(this,(ostream *)&local_1c8,tstruct);
  std::operator<<((ostream *)&local_1c8,(string *)&::endl_abi_cxx11_);
  generate_union_abstract_methods(this,(ostream *)&local_1c8,tstruct);
  std::operator<<((ostream *)&local_1c8,(string *)&::endl_abi_cxx11_);
  generate_java_struct_field_by_id(this,(ostream *)&local_1c8,tstruct_00);
  std::operator<<((ostream *)&local_1c8,(string *)&::endl_abi_cxx11_);
  generate_union_getters_and_setters(this,(ostream *)&local_1c8,tstruct);
  std::operator<<((ostream *)&local_1c8,(string *)&::endl_abi_cxx11_);
  generate_union_is_set_methods(this,(ostream *)&local_1c8,tstruct);
  std::operator<<((ostream *)&local_1c8,(string *)&::endl_abi_cxx11_);
  generate_union_comparisons(this,(ostream *)&local_1c8,tstruct);
  std::operator<<((ostream *)&local_1c8,(string *)&::endl_abi_cxx11_);
  generate_union_hashcode(this,(ostream *)&local_1c8,tstruct_01);
  std::operator<<((ostream *)&local_1c8,(string *)&::endl_abi_cxx11_);
  generate_java_struct_write_object(this,(ostream *)&local_1c8,tstruct_02);
  std::operator<<((ostream *)&local_1c8,(string *)&::endl_abi_cxx11_);
  generate_java_struct_read_object(this,(ostream *)&local_1c8,tstruct);
  std::operator<<((ostream *)&local_1c8,(string *)&::endl_abi_cxx11_);
  out = &local_1c8;
  t_oop_generator::scope_down(&this->super_t_oop_generator,(ostream *)out);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            (&local_1c8,(int)out);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update(&local_1c8);
  std::__cxx11::string::~string((string *)(local_228 + 0x40));
  return;
}

Assistant:

void t_java_generator::generate_java_union(t_struct* tstruct) {
  // Make output file
  string f_struct_name = package_dir_ + "/" + make_valid_java_filename(tstruct->get_name())
                         + ".java";
  ofstream_with_content_based_conditional_update f_struct;
  f_struct.open(f_struct_name.c_str());

  f_struct << autogen_comment() << java_package() << java_suppressions();

  generate_java_doc(f_struct, tstruct);

  bool is_final = (tstruct->annotations_.find("final") != tstruct->annotations_.end());
  bool is_deprecated = this->is_deprecated(tstruct->annotations_);

  if (!suppress_generated_annotations_) {
    generate_javax_generated_annotation(f_struct);
  }

  if (is_deprecated) {
    indent(f_struct) << "@Deprecated" << endl;
  }
  indent(f_struct) << "public " << (is_final ? "final " : "") << "class " << tstruct->get_name()
                   << " extends org.apache.thrift.TUnion<" << tstruct->get_name() << ", "
                   << tstruct->get_name() << "._Fields> ";

  scope_up(f_struct);

  generate_struct_desc(f_struct, tstruct);
  generate_field_descs(f_struct, tstruct);

  f_struct << endl;

  generate_field_name_constants(f_struct, tstruct);

  f_struct << endl;

  generate_java_meta_data_map(f_struct, tstruct);

  generate_union_constructor(f_struct, tstruct);

  f_struct << endl;

  generate_union_abstract_methods(f_struct, tstruct);

  f_struct << endl;

  generate_java_struct_field_by_id(f_struct, tstruct);

  f_struct << endl;

  generate_union_getters_and_setters(f_struct, tstruct);

  f_struct << endl;

  generate_union_is_set_methods(f_struct, tstruct);

  f_struct << endl;

  generate_union_comparisons(f_struct, tstruct);

  f_struct << endl;

  generate_union_hashcode(f_struct, tstruct);

  f_struct << endl;

  generate_java_struct_write_object(f_struct, tstruct);

  f_struct << endl;

  generate_java_struct_read_object(f_struct, tstruct);

  f_struct << endl;

  scope_down(f_struct);

  f_struct.close();
}